

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O3

void __thiscall LiteScript::Class::AddStatic(Class *this,char *name,Variable *v)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  *this_00;
  pointer ppVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  allocator local_89;
  Variable local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  local_58;
  
  this_00 = &this->s_members;
  uVar3 = ((long)(this->s_members).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->s_members).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if ((int)uVar3 != 0) {
    lVar4 = 0;
    do {
      iVar2 = std::__cxx11::string::compare
                        ((char *)((long)&(((this_00->
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->first).
                                         _M_dataplus + lVar4));
      if (iVar2 == 0) {
        ppVar1 = (this_00->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string((string *)&local_78,name,&local_89);
        Variable::Variable(&local_88,v);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
                  (&local_58,&local_78,&local_88);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
        ::_M_insert_rval(this_00,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
                                  *)((long)&(ppVar1->first)._M_dataplus + lVar4),&local_58);
        goto LAB_0013e92b;
      }
      lVar4 = lVar4 + 0x30;
    } while ((uVar3 & 0xffffffff) * 0x30 != lVar4);
  }
  std::__cxx11::string::string((string *)&local_78,name,&local_89);
  Variable::Variable(&local_88,v);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
            (&local_58,&local_78,&local_88);
  std::
  vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
  ::emplace_back<std::pair<std::__cxx11::string,LiteScript::Variable>>
            ((vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
              *)this_00,&local_58);
LAB_0013e92b:
  Variable::~Variable(&local_58.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
    operator_delete(local_58.first._M_dataplus._M_p);
  }
  Variable::~Variable(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LiteScript::Class::AddStatic(const char *name, const Variable &v) {
    for (unsigned int i = 0, sz = this->s_members.size(); i < sz; i++) {
        if (this->s_members[i].first == name) {
            this->s_members.emplace(this->s_members.begin() + i, std::pair<std::string, Variable>({ std::string(name), Variable(v) }));
            return;
        }
    }
    this->s_members.push_back({ std::string(name), Variable(v) });
}